

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_recv_disc(udp_ep *ep,udp_sp_disc *disc,nng_sockaddr *sa)

{
  void *pvVar1;
  nni_aio *aio;
  
  pvVar1 = nni_id_get(&ep->pipes,(ulong)sa & 0xffffffff);
  if (((pvVar1 != (void *)0x0) && (*(char *)((long)pvVar1 + 0xb0) == '\0')) &&
     (*(int *)((long)pvVar1 + 0xa0) == 0 || *(int *)((long)pvVar1 + 0xa0) == (int)disc)) {
    *(undefined1 *)((long)pvVar1 + 0xb0) = 1;
    aio = (nni_aio *)nni_list_first((nni_list *)((long)pvVar1 + 0x128));
    while (aio != (nni_aio *)0x0) {
      nni_aio_list_remove(aio);
      nni_aio_finish_error(aio,NNG_ECLOSED);
      aio = (nni_aio *)nni_list_first((nni_list *)((long)pvVar1 + 0x128));
    }
  }
  return;
}

Assistant:

static void
udp_recv_disc(udp_ep *ep, udp_sp_disc *disc, nng_sockaddr *sa)
{
	udp_pipe *p;
	nni_aio  *aio;
	NNI_ARG_UNUSED(sa);

	p = udp_find_pipe(ep, disc->us_peer_id, disc->us_sender_id);
	if (p != NULL) {
		// For now we aren't validating the sequence numbers.
		// This allows for an out of order DISC to cause the
		// connection to be dropped, but it should self heal.
		p->closed = true;
		while ((aio = nni_list_first(&p->rx_aios)) != NULL) {
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
	}
}